

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O2

size_t call_filter(lzma_simple_coder *coder,uint8_t *buffer,size_t size)

{
  size_t sVar1;
  
  sVar1 = (*coder->filter)(coder->simple,coder->now_pos,coder->is_encoder,buffer,size);
  coder->now_pos = coder->now_pos + (int)sVar1;
  return sVar1;
}

Assistant:

static size_t
call_filter(lzma_simple_coder *coder, uint8_t *buffer, size_t size)
{
	const size_t filtered = coder->filter(coder->simple,
			coder->now_pos, coder->is_encoder,
			buffer, size);
	coder->now_pos += filtered;
	return filtered;
}